

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxBoolCast::Resolve(FxBoolCast *this,FCompileContext *ctx)

{
  PString *pPVar1;
  PBool *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FxExpression *pFVar4;
  uint uVar5;
  FxExpression *x;
  ExpVal constval;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar3 = (*this->basex->_vptr_FxExpression[2])();
      pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
      this->basex = pFVar4;
      if (pFVar4 != (FxExpression *)0x0) {
        if (pFVar4->ValueType == (PType *)TypeBool) {
          this->basex = (FxExpression *)0x0;
        }
        else {
          iVar3 = (**(code **)(*(long *)&pFVar4->ValueType->super_DObject + 0x90))();
          if (((iVar3 == 0) ||
              (iVar3 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar3 == 1)
              ) || (iVar3 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(),
                   iVar3 == 3)) {
            iVar3 = (*this->basex->_vptr_FxExpression[3])();
            if ((char)iVar3 == '\0') {
              return &this->super_FxExpression;
            }
            pFVar4 = this->basex;
            if (pFVar4->ValueType != (PType *)TypeState) {
              pPVar1 = (PString *)pFVar4[1]._vptr_FxExpression;
              if (pPVar1 == TypeString) {
                FString::AttachToOther(&local_38,(FString *)&pFVar4[1].JumpAddresses);
              }
              else {
                local_38.Chars = (char *)pFVar4[1].JumpAddresses.Array;
              }
              pFVar4 = (FxExpression *)operator_new(0x48);
              iVar3 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
              if (iVar3 == 1) {
                uVar5 = -(uint)((double)local_38.Chars != 0.0) & 1;
              }
              else if (iVar3 == 0) {
                uVar5 = (uint)((int)local_38.Chars != 0);
              }
              else {
                uVar5 = 0;
              }
              FxExpression::FxExpression(pFVar4,&(this->super_FxExpression).ScriptPosition);
              pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
              pPVar2 = TypeBool;
              *(PBool **)(pFVar4 + 1) = TypeBool;
              pFVar4->ValueType = (PType *)pPVar2;
              *(uint *)&pFVar4[1].JumpAddresses.Array = uVar5;
              pFVar4->isresolved = true;
              (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
              if (pPVar1 != TypeString) {
                return pFVar4;
              }
              FString::~FString(&local_38);
              return pFVar4;
            }
            __assert_fail("basex->ValueType != TypeState && \"We shouldn\'t be able to generate a constant state ref\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                          ,0x1ba,"virtual FxExpression *FxBoolCast::Resolve(FCompileContext &)");
          }
          pFVar4 = (FxExpression *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return pFVar4;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxBoolCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxBoolCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeBool)
	{
		FxExpression *x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER)
	{
		if (basex->isConstant())
		{
			assert(basex->ValueType != TypeState && "We shouldn't be able to generate a constant state ref");

			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetBool(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return nullptr;
}